

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O2

void adios2::ReadResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char cVar1;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  shared_ptr<adios2::core::Operator> op;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cVar1 = *(char *)((long)vevent + 0x10);
  if (cVar1 == '\x7f') {
    memcpy(*(void **)((long)vevent + 8),*(void **)((long)vevent + 0x20),
           *(size_t *)((long)vevent + 0x18));
  }
  else {
    if (cVar1 == '\a') {
      std::__cxx11::string::string((string *)local_c8,"zfp",(allocator *)&local_70);
      local_a8._24_8_ = local_a8 + 8;
      local_a8._0_8_ = (_Base_ptr)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = (_Base_ptr)0x0;
      local_80 = 0;
      local_88 = (_Base_ptr)local_a8._24_8_;
      core::MakeOperator((string *)&op,(Params *)local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
      std::__cxx11::string::~string((string *)local_c8);
      (*(op.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Operator[0x15])
                (op.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 *(undefined8 *)((long)vevent + 0x20),*(undefined8 *)((long)vevent + 0x18),
                 *(undefined8 *)((long)vevent + 8));
    }
    else {
      if (cVar1 != '\x03') {
        std::__cxx11::string::string((string *)local_a8,"Remote",&local_e9);
        std::__cxx11::string::string((string *)local_c8,"EVPathRemote",&local_ea);
        std::__cxx11::string::string((string *)&op,"ReadResponseHandler",&local_eb);
        std::__cxx11::to_string(&local_50,(uint)*(byte *)((long)vevent + 0x10));
        std::operator+(&local_30,"Invalid operator type ",&local_50);
        std::operator+(&local_70,&local_30," received in response");
        helper::Throw<std::invalid_argument>
                  ((string *)local_a8,(string *)local_c8,(string *)&op,&local_70,-1);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_30);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&op);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)local_a8);
        goto LAB_00609d35;
      }
      std::__cxx11::string::string((string *)local_c8,"mgard",(allocator *)&local_70);
      local_a8._24_8_ = local_a8 + 8;
      local_a8._0_8_ = (_Base_ptr)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = (_Base_ptr)0x0;
      local_80 = 0;
      local_88 = (_Base_ptr)local_a8._24_8_;
      core::MakeOperator((string *)&op,(Params *)local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
      std::__cxx11::string::~string((string *)local_c8);
      (*(op.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Operator[0x15])
                (op.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 *(undefined8 *)((long)vevent + 0x20),*(undefined8 *)((long)vevent + 0x18),
                 *(undefined8 *)((long)vevent + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&op.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_00609d35:
  CMCondition_signal(cm,*vevent);
  return;
}

Assistant:

void ReadResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                         attr_list attrs)
{
    EVPathRemoteCommon::ReadResponseMsg read_response_msg =
        static_cast<EVPathRemoteCommon::ReadResponseMsg>(vevent);

    switch (read_response_msg->OperatorType)
    {
    case adios2::core::Operator::OperatorType::COMPRESS_MGARD: {
        auto op = adios2::core::MakeOperator("mgard", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_ZFP: {
        auto op = adios2::core::MakeOperator("zfp", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_NULL:
        memcpy(read_response_msg->Dest, read_response_msg->ReadData, read_response_msg->Size);
        break;
    default:
        helper::Throw<std::invalid_argument>("Remote", "EVPathRemote", "ReadResponseHandler",
                                             "Invalid operator type " +
                                                 std::to_string(read_response_msg->OperatorType) +
                                                 " received in response");
    }
    CMCondition_signal(cm, read_response_msg->ReadResponseCondition);
    return;
}